

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiheadattention_x86_avx.cpp
# Opt level: O0

void __thiscall
ncnn::MultiHeadAttention_x86_avx::MultiHeadAttention_x86_avx(MultiHeadAttention_x86_avx *this)

{
  undefined8 *in_RDI;
  MultiHeadAttention *in_stack_00000058;
  
  MultiHeadAttention::MultiHeadAttention(in_stack_00000058);
  *in_RDI = &PTR__MultiHeadAttention_x86_avx_02021520;
  *(undefined1 *)((long)in_RDI + 0xb) = 1;
  in_RDI[0x82] = 0;
  in_RDI[0x83] = 0;
  in_RDI[0x84] = 0;
  in_RDI[0x86] = 0;
  in_RDI[0x87] = 0;
  in_RDI[0x88] = 0;
  in_RDI[0x85] = 0;
  return;
}

Assistant:

MultiHeadAttention_x86_avx::MultiHeadAttention_x86_avx()
{
#if __SSE2__
    support_packing = true;
#endif // __SSE2__

    q_gemm = 0;
    k_gemm = 0;
    v_gemm = 0;

    qk_gemm = 0;
    qkv_gemm = 0;

    qk_softmax = 0;

    o_gemm = 0;
}